

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O0

int run_test_tcp_close_reset_accepted(void)

{
  int iVar1;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,&tcp_server);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,&tcp_client);
  if ((long)write_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x110,"write_cb_called","==","0",(long)write_cb_called,"==",0);
    abort();
  }
  if ((long)close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x111,"close_cb_called","==","0",(long)close_cb_called,"==",0);
    abort();
  }
  if ((long)shutdown_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x112,"shutdown_cb_called","==","0",(long)shutdown_cb_called,"==",0);
    abort();
  }
  iVar1 = uv_run(loop,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x115,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)write_cb_called != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x117,"4","==","write_cb_called",4,"==",(long)write_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x118,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  if ((long)shutdown_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x119,"shutdown_cb_called","==","0",(long)shutdown_cb_called,"==",0);
    abort();
  }
  close_loop(loop);
  iVar1 = uv_loop_close(loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
            ,0x11b,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}